

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setFilterOperator
          (CommonCore *this,InterfaceHandle filter,shared_ptr<helics::FilterOperator> *callback)

{
  uint16_t uVar1;
  int iVar2;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var3;
  InvalidIdentifier *this_00;
  char *pcVar4;
  string_view message;
  size_t sStack_f0;
  ActionMessage filtOpUpdate;
  
  if (setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)::nullFilt
      == '\0') {
    iVar2 = __cxa_guard_acquire(&setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)
                                 ::nullFilt);
    if (iVar2 != 0) {
      std::make_shared<helics::NullFilterOperator>();
      setFilterOperator::nullFilt.
      super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           filtOpUpdate.messageID;
      setFilterOperator::nullFilt.
      super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           filtOpUpdate.messageAction;
      setFilterOperator::nullFilt.
      super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = filtOpUpdate.source_id.gid;
      setFilterOperator::nullFilt.
      super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = filtOpUpdate.source_handle.hid;
      filtOpUpdate.messageAction = cmd_ignore;
      filtOpUpdate.messageID = 0;
      filtOpUpdate.source_id.gid = 0;
      filtOpUpdate.source_handle.hid = 0;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filtOpUpdate.source_id);
      __cxa_atexit(std::__shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&setFilterOperator::nullFilt,&__dso_handle);
      __cxa_guard_release(&setFilterOperator(helics::InterfaceHandle,std::shared_ptr<helics::FilterOperator>)
                           ::nullFilt);
    }
  }
  p_Var3 = getHandleInfo(this,filter);
  if (p_Var3 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "filter is not a valid handle";
    sStack_f0 = 0x1c;
  }
  else {
    if ((p_Var3->
        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
        ._M_storage._M_storage.__data[4] == 'f') {
      ActionMessage::ActionMessage(&filtOpUpdate,cmd_core_configure);
      filtOpUpdate.messageID = 0x23c;
      if ((callback->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          == (element_type *)0x0) {
        std::__shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&callback->super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>
                   ,&setFilterOperator::nullFilt.
                     super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>);
      }
      uVar1 = getNextAirlockIndex(this);
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::shared_ptr<helics::FilterOperator>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar1),callback);
      filtOpUpdate.source_id.gid = *(BaseType *)&(p_Var3->super__Hash_node_base)._M_nxt;
      filtOpUpdate.source_handle.hid = filter.hid;
      filtOpUpdate.counter = uVar1;
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &(this->super_BrokerBase).actionQueue,&filtOpUpdate);
      ActionMessage::~ActionMessage(&filtOpUpdate);
      return;
    }
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "filter identifier does not point a filter";
    sStack_f0 = 0x29;
  }
  message._M_str = pcVar4;
  message._M_len = sStack_f0;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setFilterOperator(InterfaceHandle filter, std::shared_ptr<FilterOperator> callback)
{
    static const std::shared_ptr<FilterOperator> nullFilt = std::make_shared<NullFilterOperator>();
    const auto* hndl = getHandleInfo(filter);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("filter is not a valid handle"));
    }
    if ((hndl->handleType != InterfaceType::FILTER)) {
        throw(InvalidIdentifier("filter identifier does not point a filter"));
    }
    ActionMessage filtOpUpdate(CMD_CORE_CONFIGURE);
    filtOpUpdate.messageID = UPDATE_FILTER_OPERATOR;
    if (!callback) {
        callback = nullFilt;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callback));
    filtOpUpdate.counter = index;
    filtOpUpdate.source_id = hndl->getFederateId();
    filtOpUpdate.source_handle = filter;
    actionQueue.push(filtOpUpdate);
}